

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int resolveAsName(Parse *pParse,ExprList *pEList,Expr *pE)

{
  Expr *zRight;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  iVar1 = 0;
  if ((char)pEList->nExpr == ';') {
    zRight = pEList->a[0].pExpr;
    uVar2 = (ulong)*(uint *)&pParse->db;
    if ((int)*(uint *)&pParse->db < 1) {
      uVar2 = 0;
    }
    uVar3 = 0;
    do {
      while( true ) {
        if (uVar3 == uVar2) {
          return 0;
        }
        if ((&pParse->pVdbe)[uVar3 * 4] != (Vdbe *)0x0) break;
        uVar3 = uVar3 + 1;
      }
      iVar1 = sqlite3StrICmp((char *)(&pParse->pVdbe)[uVar3 * 4],(char *)zRight);
      uVar3 = uVar3 + 1;
    } while (iVar1 != 0);
    iVar1 = (int)uVar3;
  }
  return iVar1;
}

Assistant:

static int resolveAsName(
  Parse *pParse,     /* Parsing context for error messages */
  ExprList *pEList,  /* List of expressions to scan */
  Expr *pE           /* Expression we are trying to match */
){
  int i;             /* Loop counter */

  UNUSED_PARAMETER(pParse);

  if( pE->op==TK_ID ){
    char *zCol = pE->u.zToken;
    for(i=0; i<pEList->nExpr; i++){
      char *zAs = pEList->a[i].zName;
      if( zAs!=0 && sqlite3StrICmp(zAs, zCol)==0 ){
        return i+1;
      }
    }
  }
  return 0;
}